

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.h
# Opt level: O0

void sx_pool_del(sx_pool *pool,void *ptr)

{
  int iVar1;
  code *pcVar2;
  int capacity;
  int item_sz;
  sx__pool_page *page;
  uintptr_t uptr;
  void *ptr_local;
  sx_pool *pool_local;
  
  _capacity = pool->pages;
  while( true ) {
    if (_capacity == (sx__pool_page *)0x0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                        ,0xe0,"pointer does not blong to the pool");
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    if ((_capacity->buff <= ptr) &&
       (ptr < _capacity->buff + (long)pool->capacity * (long)pool->item_sz)) break;
    _capacity = _capacity->next;
  }
  if ((ulong)((long)ptr - (long)_capacity->buff) % (ulong)(long)pool->item_sz != 0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                      ,0xd6,"ptr is not aligned to items, probably invalid");
    pcVar2 = (code *)swi(3);
    (*pcVar2)();
    return;
  }
  if (_capacity->iter == pool->capacity) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                      ,0xd8,"cannot delete more objects, possible double delete");
    pcVar2 = (code *)swi(3);
    (*pcVar2)();
    return;
  }
  iVar1 = _capacity->iter;
  _capacity->iter = iVar1 + 1;
  _capacity->ptrs[iVar1] = ptr;
  return;
}

Assistant:

SX_INLINE void sx_pool_del(sx_pool* pool, void* ptr)
{
    uintptr_t uptr = (uintptr_t)ptr;
    sx__pool_page* page = pool->pages;
    int item_sz = pool->item_sz;
    int capacity = pool->capacity;

    while (page) {
        if (uptr >= (uintptr_t)page->buff &&
            uptr < (uintptr_t)(page->buff + (size_t)capacity * (size_t)item_sz)) {
            sx_assertf((uintptr_t)((uint8_t*)ptr - page->buff) % item_sz == 0,
                      "ptr is not aligned to items, probably invalid");
            sx_assertf(page->iter != capacity,
                      "cannot delete more objects, possible double delete");

            page->ptrs[page->iter++] = ptr;
            return;
        }

        page = page->next;
    }
    sx_assertf(0, "pointer does not blong to the pool");
}